

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine.cpp
# Opt level: O0

bool __thiscall
QTextLineItemIterator::getSelectionBounds
          (QTextLineItemIterator *this,QFixed *selectionX,QFixed *selectionWidth)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  QFixed QVar5;
  unsigned_short *puVar6;
  int *piVar7;
  QFixed *in_RDX;
  int *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int g_3;
  int g_2;
  int g_1;
  int g;
  int end_glyph;
  int start_glyph;
  int to;
  int from;
  unsigned_short *logClusters;
  QFixed leftOffsetInLigature;
  QFixed swidth;
  QFixed soff;
  QGlyphLayout glyphs;
  QScriptItem *in_stack_ffffffffffffff28;
  QFixed in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff35;
  undefined2 in_stack_ffffffffffffff36;
  ushort uVar8;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint local_b4;
  int local_ac;
  uint in_stack_ffffffffffffff5c;
  QFixed in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  bool local_65;
  QFixed local_48;
  QFixed local_44;
  int local_40;
  QFixed local_3c;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QFixed::QFixed(&local_3c,0);
  in_RDX->val = local_3c.val;
  *in_RSI = in_RDX->val;
  if (in_RDI[0x8e] == 0) {
    local_65 = false;
  }
  else {
    if ((*(uint *)(in_RDI[3] + 4) >> 8 & 0xf) < 7) {
      puVar6 = QTextEngine::logClusters((QTextEngine *)*in_RDI,(QScriptItem *)in_RDI[3]);
      memset(local_38,0xaa,0x30);
      QTextEngine::shapedGlyphs
                ((QTextEngine *)
                 CONCAT26(in_stack_ffffffffffffff36,
                          CONCAT15(in_stack_ffffffffffffff35,
                                   CONCAT14(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30.val)
                                  )),in_stack_ffffffffffffff28);
      piVar7 = qMax<int>((int *)(in_RDI + 9),(int *)in_RDI[0x8e]);
      iVar1 = *piVar7 - *(int *)in_RDI[3];
      local_40 = *(int *)in_RDI[0x8e] + *(int *)(in_RDI[0x8e] + 4);
      piVar7 = qMin<int>((int *)((long)in_RDI + 0x4c),&local_40);
      iVar2 = *piVar7 - *(int *)in_RDI[3];
      if (iVar2 <= iVar1) {
        local_65 = false;
        goto LAB_00830d19;
      }
      uVar3 = (uint)puVar6[iVar1];
      if (iVar2 == *(int *)((long)in_RDI + 0x3c)) {
        uVar8 = *(ushort *)(in_RDI[3] + 8);
      }
      else {
        uVar8 = puVar6[iVar2];
      }
      uVar4 = (uint)uVar8;
      local_44.val = -0x55555556;
      QFixed::QFixed(&local_44);
      local_48.val = -0x55555556;
      QFixed::QFixed(&local_48);
      if ((*(uint *)(in_RDI[3] + 4) >> 0x10 & 0xff) % 2 == 0) {
        local_b4 = uVar3;
        for (local_ac = *(int *)(in_RDI + 8); uVar3 = local_b4, local_ac < (int)local_b4;
            local_ac = local_ac + 1) {
          QVar5 = QGlyphLayout::effectiveAdvance
                            ((QGlyphLayout *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                             (int)((ulong)in_RDI >> 0x20));
          QFixed::operator+=(&local_44,QVar5);
        }
        for (; (int)local_b4 < (int)uVar4; local_b4 = local_b4 + 1) {
          QVar5 = QGlyphLayout::effectiveAdvance
                            ((QGlyphLayout *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                             (int)((ulong)in_RDI >> 0x20));
          QFixed::operator+=(&local_48,QVar5);
        }
      }
      else {
        in_stack_ffffffffffffff64 = *(int *)((long)in_RDI + 0x44);
        while (in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 + -1,
              in_stack_ffffffffffffff5c = uVar4, (int)uVar4 <= in_stack_ffffffffffffff64) {
          in_stack_ffffffffffffff60 =
               QGlyphLayout::effectiveAdvance
                         ((QGlyphLayout *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (int)((ulong)in_RDI >> 0x20));
          QFixed::operator+=(&local_44,in_stack_ffffffffffffff60);
        }
        while (in_stack_ffffffffffffff5c = in_stack_ffffffffffffff5c - 1,
              (int)uVar3 <= (int)in_stack_ffffffffffffff5c) {
          QVar5 = QGlyphLayout::effectiveAdvance
                            ((QGlyphLayout *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                             (int)((ulong)in_RDI >> 0x20));
          QFixed::operator+=(&local_48,QVar5);
        }
      }
      QTextEngine::offsetInLigature
                ((QTextEngine *)CONCAT44(iVar1,iVar2),(QScriptItem *)CONCAT44(uVar3,uVar4),
                 in_stack_ffffffffffffff64,in_stack_ffffffffffffff60.val,in_stack_ffffffffffffff5c);
      QFixed::operator+((QFixed *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
      QVar5 = QFixed::operator+((QFixed *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
      *in_RSI = QVar5.val;
      QVar5 = QFixed::operator-((QFixed *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
      in_RDX->val = QVar5.val;
      QVar5 = QTextEngine::offsetInLigature
                        ((QTextEngine *)CONCAT44(iVar1,iVar2),(QScriptItem *)CONCAT44(uVar3,uVar4),
                         in_stack_ffffffffffffff64,in_stack_ffffffffffffff60.val,
                         in_stack_ffffffffffffff5c);
      QFixed::operator+=(in_RDX,QVar5);
    }
    else {
      if ((*(int *)in_RDI[0x8e] + *(int *)(in_RDI[0x8e] + 4) <= *(int *)in_RDI[3]) ||
         (*(int *)in_RDI[3] + *(int *)((long)in_RDI + 0x3c) <= *(int *)in_RDI[0x8e])) {
        local_65 = false;
        goto LAB_00830d19;
      }
      *in_RSI = *(int *)(in_RDI + 1);
      in_RDX->val = *(int *)(in_RDI + 10);
    }
    local_65 = true;
  }
LAB_00830d19:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_65;
}

Assistant:

bool QTextLineItemIterator::getSelectionBounds(QFixed *selectionX, QFixed *selectionWidth) const
{
    *selectionX = *selectionWidth = 0;

    if (!selection)
        return false;

    if (si->analysis.flags >= QScriptAnalysis::TabOrObject) {
        if (si->position >= selection->start + selection->length
            || si->position + itemLength <= selection->start)
            return false;

        *selectionX = x;
        *selectionWidth = itemWidth;
    } else {
        unsigned short *logClusters = eng->logClusters(si);
        QGlyphLayout glyphs = eng->shapedGlyphs(si);

        int from = qMax(itemStart, selection->start) - si->position;
        int to = qMin(itemEnd, selection->start + selection->length) - si->position;
        if (from >= to)
            return false;

        int start_glyph = logClusters[from];
        int end_glyph = (to == itemLength) ? si->num_glyphs : logClusters[to];
        QFixed soff;
        QFixed swidth;
        if (si->analysis.bidiLevel %2) {
            for (int g = glyphsEnd - 1; g >= end_glyph; --g)
                soff += glyphs.effectiveAdvance(g);
            for (int g = end_glyph - 1; g >= start_glyph; --g)
                swidth += glyphs.effectiveAdvance(g);
        } else {
            for (int g = glyphsStart; g < start_glyph; ++g)
                soff += glyphs.effectiveAdvance(g);
            for (int g = start_glyph; g < end_glyph; ++g)
                swidth += glyphs.effectiveAdvance(g);
        }

        // If the starting character is in the middle of a ligature,
        // selection should only contain the right part of that ligature
        // glyph, so we need to get the width of the left part here and
        // add it to *selectionX
        QFixed leftOffsetInLigature = eng->offsetInLigature(si, from, to, start_glyph);
        *selectionX = x + soff + leftOffsetInLigature;
        *selectionWidth = swidth - leftOffsetInLigature;
        // If the ending character is also part of a ligature, swidth does
        // not contain that part yet, we also need to find out the width of
        // that left part
        *selectionWidth += eng->offsetInLigature(si, to, itemLength, end_glyph);
    }
    return true;
}